

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QStringView,QXmlStreamReaderPrivate::Entity>::
emplace_helper<QXmlStreamReaderPrivate::Entity_const&>
          (QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *this,QStringView *key,Entity *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *in_RDX;
  Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  QStringView *in_stack_ffffffffffffff88;
  Node<QStringView,_QXmlStreamReaderPrivate::Entity> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::
  findOrInsert<QStringView>(in_RSI,(QStringView *)in_RDX);
  QHashPrivate::iterator<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::node
            (in_RDX);
  QHashPrivate::Node<QStringView,QXmlStreamReaderPrivate::Entity>::
  createInPlace<QXmlStreamReaderPrivate::Entity_const&>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(Entity *)0x65f7b3);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)
         in_stack_ffffffffffffff90;
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::iterator::iterator
            ((iterator *)in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }